

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMRegressor.pb.cc
# Opt level: O2

uint8_t * __thiscall
CoreML::Specification::GLMRegressor_DoubleArray::_InternalSerialize
          (GLMRegressor_DoubleArray *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  int iVar1;
  uint uVar2;
  uint8_t *puVar3;
  LogMessage *other;
  ulong uVar4;
  uint size;
  LogFinisher local_61;
  LogMessage local_60;
  
  if (0 < (this->value_).current_size_) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    iVar1 = (this->value_).current_size_;
    if (stream->end_ <= puVar3) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x36d);
      other = google::protobuf::internal::LogMessage::operator<<
                        (&local_60,"CHECK failed: ptr < end_: ");
      google::protobuf::internal::LogFinisher::operator=(&local_61,other);
      google::protobuf::internal::LogMessage::~LogMessage(&local_60);
    }
    *puVar3 = '\n';
    puVar3 = puVar3 + 2;
    size = iVar1 << 3;
    for (uVar2 = size; 0x7f < uVar2; uVar2 = uVar2 >> 7) {
      puVar3[-1] = (byte)uVar2 | 0x80;
      puVar3 = puVar3 + 1;
    }
    puVar3[-1] = (byte)uVar2;
    target = google::protobuf::io::EpsCopyOutputStream::WriteRaw
                       (stream,(this->value_).arena_or_elements_,size,puVar3);
  }
  uVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar4 & 1) != 0) {
    uVar4 = uVar4 & 0xfffffffffffffffc;
    target = google::protobuf::io::EpsCopyOutputStream::WriteRaw
                       (stream,*(void **)(uVar4 + 8),*(int *)(uVar4 + 0x10),target);
  }
  return target;
}

Assistant:

uint8_t* GLMRegressor_DoubleArray::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.GLMRegressor.DoubleArray)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated double value = 1;
  if (this->_internal_value_size() > 0) {
    target = stream->WriteFixedPacked(1, _internal_value(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.GLMRegressor.DoubleArray)
  return target;
}